

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h265e_stream.c
# Opt level: O1

MPP_RET h265e_stream_write_se_with_log(H265eStream *s,RK_S32 val,char *name)

{
  byte bVar1;
  uint val_00;
  uint uVar2;
  
  val_00 = val * -2 + 1;
  if (0 < val) {
    val_00 = val * 2;
  }
  uVar2 = val_00 >> 8;
  if ((int)val_00 < 0x100) {
    uVar2 = val_00;
  }
  bVar1 = "\x01\x01\x03\x03\x05\x05\x05\x05\a\a\a\a\a\a\a\a\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\r\r\r\r\r\r\r\r\r\r\r\r\r\r\r\r\r\r\r\r\r\r\r\r\r\r\r\r\r\r\r\r\r\r\r\r\r\r\r\r\r\r\r\r\r\r\r\r\r\r\r\r\r\r\r\r\r\r\r\r\r\r\r\r\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f\x0f"
          [(int)uVar2];
  if ((h265e_debug._1_1_ & 2) != 0) {
    _mpp_log_l(4,"h265e_stream","write SE bits name %s, val %d ",(char *)0x0,name,(ulong)val_00);
  }
  h265e_stream_write_with_log(s,val_00,(uint)(0xff < (int)val_00) * 0x10 + (uint)bVar1,name);
  return MPP_OK;
}

Assistant:

MPP_RET h265e_stream_write_se_with_log(H265eStream *s,
                                       RK_S32 val, char *name)
{
    RK_S32 size = 0;
    RK_S32 tmp = 1 - val * 2;
    if (tmp < 0)
        tmp = val * 2;

    val = tmp;
    if (tmp >= 0x100) {
        size = 16;
        tmp >>= 8;
    }
    size += ue_size_tab[tmp];

    h265e_dbg(H265E_DBG_HEADER,
              "write SE bits name %s, val %d ",
              name, val);

    return h265e_stream_write_with_log(s, val, size, name);;
}